

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-helpers.c++
# Opt level: O3

bool kj::_::hasSubstring(StringPtr haystack,StringPtr needle)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = haystack.content.size_;
  uVar2 = needle.content.size_;
  if (uVar2 - 1 <= uVar5 - 1) {
    uVar3 = uVar5 - uVar2;
    uVar4 = 0;
    do {
      if ((uVar2 <= uVar5) &&
         (iVar1 = bcmp(haystack.content.ptr + uVar4,needle.content.ptr,uVar2 - 1), iVar1 == 0)) {
        return true;
      }
      uVar4 = uVar4 + 1;
      uVar5 = uVar5 - 1;
    } while (uVar4 <= uVar3);
  }
  return false;
}

Assistant:

bool hasSubstring(StringPtr haystack, StringPtr needle) {
  // TODO(perf): This is not the best algorithm for substring matching.
  if (needle.size() <= haystack.size()) {
    for (size_t i = 0; i <= haystack.size() - needle.size(); i++) {
      if (haystack.slice(i).startsWith(needle)) {
        return true;
      }
    }
  }
  return false;
}